

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O3

Node * __thiscall DepsLog::GetFirstReverseDepsNode(DepsLog *this,Node *node)

{
  pointer ppDVar1;
  Deps *pDVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  ppDVar1 = (this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppDVar1;
  if (lVar3 == 0) {
    return (Node *)0x0;
  }
  lVar3 = lVar3 >> 3;
  lVar4 = 0;
  do {
    pDVar2 = ppDVar1[lVar4];
    if ((pDVar2 != (Deps *)0x0) && (0 < (long)pDVar2->node_count)) {
      lVar5 = 0;
      do {
        if (pDVar2->nodes[lVar5] == node) {
          return (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar4];
        }
        lVar5 = lVar5 + 1;
      } while (pDVar2->node_count != lVar5);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != lVar3 + (ulong)(lVar3 == 0));
  return (Node *)0x0;
}

Assistant:

Node* DepsLog::GetFirstReverseDepsNode(Node* node) {
  for (size_t id = 0; id < deps_.size(); ++id) {
    Deps* deps = deps_[id];
    if (!deps)
      continue;
    for (int i = 0; i < deps->node_count; ++i) {
      if (deps->nodes[i] == node)
        return nodes_[id];
    }
  }
  return NULL;
}